

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::expr_peek_save_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this)

{
  opt_t *poVar1;
  string local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  InputAPI *local_18;
  InputAPI *this_local;
  
  local_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  poVar1 = Opt::operator->((Opt *)&opts);
  std::operator+(&local_58,&poVar1->yych," = ");
  Opt::yychConversion_abi_cxx11_(&local_78,(Opt *)&opts);
  std::operator+(&local_38,&local_58,&local_78);
  expr_peek_abi_cxx11_(&local_a8,this);
  std::operator+(__return_storage_ptr__,&local_38,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_peek_save () const
{
	return opts->yych + " = " + opts.yychConversion () + expr_peek ();
}